

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testURI.c
# Opt level: O1

void handleURI(char *str)

{
  uint uVar1;
  long *plVar2;
  char *__s;
  long lVar3;
  
  plVar2 = (long *)xmlCreateURI();
  if (base == (char *)0x0) {
    uVar1 = xmlParseURIReference(plVar2,str);
    if (uVar1 == 0) {
      if (debug != 0) {
        if (*plVar2 != 0) {
          printf("scheme: %s\n");
        }
        if (plVar2[1] != 0) {
          printf("opaque: %s\n");
        }
        if (plVar2[2] != 0) {
          printf("authority: %s\n");
        }
        if (plVar2[3] != 0) {
          printf("server: %s\n");
        }
        if (plVar2[4] != 0) {
          printf("user: %s\n");
        }
        if ((int)plVar2[5] != 0) {
          printf("port: %d\n");
        }
        if (plVar2[6] != 0) {
          printf("path: %s\n");
        }
        if (plVar2[7] != 0) {
          printf("query: %s\n");
        }
        if (plVar2[8] != 0) {
          printf("fragment: %s\n");
        }
        if (plVar2[10] != 0) {
          printf("query_raw: %s\n");
        }
        if ((int)plVar2[9] != 0) {
          puts("cleanup");
        }
      }
      xmlNormalizeURIPath(plVar2[6]);
      if (escape != 0) {
        lVar3 = xmlSaveUri(plVar2);
        __s = (char *)xmlURIEscape(lVar3);
        puts(__s);
        goto LAB_00101481;
      }
      xmlPrintURI(_stdout,plVar2);
      putchar(10);
      goto LAB_0010147b;
    }
    __s = (char *)0x0;
    printf("%s : error %d\n",str,(ulong)uVar1);
  }
  else {
    if (relative == 0) {
      __s = (char *)xmlBuildURI(str);
    }
    else {
      __s = (char *)xmlBuildRelativeURI(str);
    }
    if (__s == (char *)0x0) {
      puts("::ERROR::");
LAB_0010147b:
      __s = (char *)0x0;
    }
    else {
      puts(__s);
    }
  }
  lVar3 = 0;
LAB_00101481:
  if (__s != (char *)0x0) {
    (*_xmlFree)(__s);
  }
  if (lVar3 != 0) {
    (*_xmlFree)(lVar3);
  }
  xmlFreeURI(plVar2);
  return;
}

Assistant:

static void handleURI(const char *str) {
    int ret;
    xmlURIPtr uri;
    xmlChar *res = NULL, *parsed = NULL;

    uri = xmlCreateURI();

    if (base == NULL) {
	ret = xmlParseURIReference(uri, str);
	if (ret != 0)
	    printf("%s : error %d\n", str, ret);
	else {
	    if (debug) {
	        if (uri->scheme) printf("scheme: %s\n", uri->scheme);
	        if (uri->opaque) printf("opaque: %s\n", uri->opaque);
	        if (uri->authority) printf("authority: %s\n", uri->authority);
	        if (uri->server) printf("server: %s\n", uri->server);
	        if (uri->user) printf("user: %s\n", uri->user);
	        if (uri->port != 0) printf("port: %d\n", uri->port);
	        if (uri->path) printf("path: %s\n", uri->path);
	        if (uri->query) printf("query: %s\n", uri->query);
	        if (uri->fragment) printf("fragment: %s\n", uri->fragment);
	        if (uri->query_raw) printf("query_raw: %s\n", uri->query_raw);
	        if (uri->cleanup != 0) printf("cleanup\n");
	    }
	    xmlNormalizeURIPath(uri->path);
	    if (escape != 0) {
		parsed = xmlSaveUri(uri);
		res = xmlURIEscape(parsed);
		printf("%s\n", (char *) res);

	    } else {
		xmlPrintURI(stdout, uri);
		printf("\n");
	    }
	}
    } else {
	if (relative) {
	    res = xmlBuildRelativeURI((xmlChar *)str, (xmlChar *) base);
	} else {
	    res = xmlBuildURI((xmlChar *)str, (xmlChar *) base);
	}

	if (res != NULL) {
	    printf("%s\n", (char *) res);
	}
	else
	    printf("::ERROR::\n");
    }
    if (res != NULL)
	xmlFree(res);
    if (parsed != NULL)
	xmlFree(parsed);
    xmlFreeURI(uri);
}